

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM __ptr;
  long lVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_INT RVar9;
  long lVar10;
  uint uVar11;
  
  if (((-1 < node) && (node < ref_adj->nnode)) &&
     (lVar4 = (long)ref_adj->first[(uint)node], lVar4 != -1)) {
    if (ref_adj->item[lVar4].ref != reference) {
      do {
        lVar4 = (long)ref_adj->item[(int)lVar4].next;
        if (lVar4 == -1) goto ref_adj_add;
      } while (ref_adj->item[lVar4].ref != reference);
    }
    return 0;
  }
ref_adj_add:
  if (node < 0) {
    return 3;
  }
  uVar11 = ref_adj->nnode;
  uVar6 = uVar11;
  if (node < (int)uVar11) {
LAB_001c04c1:
    uVar11 = ref_adj->blank;
    if (uVar11 == 0xffffffff) {
      uVar11 = ref_adj->nitem;
      lVar4 = (long)(int)uVar11;
      if (lVar4 == 0x7fffffff) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
               "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
        return 1;
      }
      uVar6 = 100;
      if (100 < (int)((double)(int)uVar11 * 0.5)) {
        uVar6 = (int)((double)(int)uVar11 * 0.5);
      }
      uVar1 = uVar11 ^ 0x7fffffff;
      if ((int)uVar6 < (int)(uVar11 ^ 0x7fffffff)) {
        uVar1 = uVar6;
      }
      ref_adj->nitem = uVar1 + uVar11;
      fflush(_stdout);
      __ptr = ref_adj->item;
      if (0 < (long)ref_adj->nitem) {
        __ptr = (REF_ADJ_ITEM)realloc(__ptr,(long)ref_adj->nitem << 3);
        ref_adj->item = __ptr;
      }
      if (__ptr == (REF_ADJ_ITEM)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
               "ref_adj_add","realloc ref_adj->item NULL");
        uVar8 = (ulong)ref_adj->nitem;
        lVar4 = uVar8 * 8;
        uVar7 = 8;
        goto LAB_001c066f;
      }
      iVar5 = ref_adj->nitem;
      if ((int)uVar11 < iVar5) {
        lVar10 = 0;
        do {
          __ptr[lVar4 + lVar10].ref = -1;
          __ptr[lVar4 + lVar10].next = uVar11 + 1 + (int)lVar10;
          lVar10 = lVar10 + 1;
        } while (iVar5 - lVar4 != lVar10);
      }
      __ptr[(long)iVar5 + -1].next = -1;
      uVar6 = ref_adj->nnode;
    }
    else {
      __ptr = ref_adj->item;
    }
    ref_adj->blank = __ptr[(int)uVar11].next;
    __ptr[(int)uVar11].ref = reference;
    pRVar3 = ref_adj->first;
    RVar9 = -1;
    if (node < (int)uVar6) {
      RVar9 = pRVar3[(uint)node];
    }
    __ptr[(int)uVar11].next = RVar9;
    pRVar3[(uint)node] = uVar11;
    RVar2 = 0;
  }
  else {
    iVar5 = 0;
    if (0 < (int)(node - uVar11)) {
      iVar5 = node - uVar11;
    }
    uVar6 = iVar5 + 100U;
    if ((int)(iVar5 + 100U) <= (int)((double)(int)uVar11 * 0.5)) {
      uVar6 = (int)((double)(int)uVar11 * 0.5);
    }
    uVar1 = uVar11 ^ 0x7fffffff;
    if ((int)uVar6 < (int)(uVar11 ^ 0x7fffffff)) {
      uVar1 = uVar6;
    }
    ref_adj->nnode = uVar1 + uVar11;
    fflush(_stdout);
    pRVar3 = ref_adj->first;
    if (0 < (long)ref_adj->nnode) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar3;
    }
    if (pRVar3 != (REF_INT *)0x0) {
      uVar6 = ref_adj->nnode;
      if ((int)uVar11 < ref_adj->nnode) {
        lVar4 = (long)(int)uVar11;
        do {
          pRVar3[lVar4] = -1;
          lVar4 = lVar4 + 1;
          uVar6 = ref_adj->nnode;
        } while (lVar4 < ref_adj->nnode);
      }
      goto LAB_001c04c1;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
           "ref_adj_add","realloc ref_adj->first NULL");
    uVar8 = (ulong)ref_adj->nnode;
    lVar4 = uVar8 * 4;
    uVar7 = 4;
LAB_001c066f:
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar8 & 0xffffffff,uVar8,uVar7
           ,lVar4);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj, REF_INT node,
                                        REF_INT reference) {
  REF_INT item, ref;

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      return REF_SUCCESS;
    }
  }

  return ref_adj_add(ref_adj, node, reference);
}